

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

void __thiscall
pstore::command_line::
list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
::list<char[4]>(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *this,char (*mods) [4])

{
  option::option(&this->super_option,zero_or_more);
  (this->super_option)._vptr_option = (_func_int **)&PTR__list_001ac610;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parser_).super_parser_base._vptr_parser_base = (_func_int **)&PTR__parser_001afd50;
  (this->values_).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->values_;
  (this->values_).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->values_;
  (this->values_).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,char_const(&)[4]>
            (this,mods);
  return;
}

Assistant:

explicit list (Mods const &... mods)
                    : option (num_occurrences_flag::zero_or_more) {
                apply_to_option (*this, mods...);
            }